

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flagser-count.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  iterator iVar1;
  undefined8 extraout_RAX;
  long *plVar2;
  char *pcVar3;
  ostream *poVar4;
  int extraout_EDX;
  positional_arguments_t positional_arguments;
  vector<unsigned_long,_std::allocator<unsigned_long>_> cell_count;
  string local_258;
  named_arguments_t named_arguments;
  cli_arguments_t arguments;
  filtered_directed_graph_t graph;
  flagser_parameters params;
  
  parse_arguments_abi_cxx11_(&arguments,argc,argv);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&positional_arguments,&arguments.first);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&named_arguments._M_h,&arguments.second._M_h);
  flagser_parameters::flagser_parameters(&params,&named_arguments);
  std::__cxx11::string::string((string *)&graph,"help",(allocator *)&cell_count);
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments._M_h,(key_type *)&graph);
  std::__cxx11::string::~string((string *)&graph);
  if ((iVar1.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
       ._M_cur == (__node_type *)0x0) &&
     (positional_arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      positional_arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    std::__cxx11::string::string
              ((string *)&local_258,
               *positional_arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                ._M_impl.super__Vector_impl_data._M_start,(allocator *)&cell_count);
    read_filtered_directed_graph(&graph,&local_258,&params);
    std::__cxx11::string::~string((string *)&local_258);
    count_cells(&cell_count,&graph,&params);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&cell_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    filtered_directed_graph_t::~filtered_directed_graph_t(&graph);
    flagser_parameters::~flagser_parameters(&params);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&named_arguments._M_h);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&positional_arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
              );
    std::
    pair<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
    ::~pair(&arguments);
  }
  else {
    print_usage_and_exit(-1);
    filtered_directed_graph_t::~filtered_directed_graph_t(&graph);
    flagser_parameters::~flagser_parameters(&params);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&named_arguments._M_h);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&positional_arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
              );
    std::
    pair<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
    ::~pair(&arguments);
    if (extraout_EDX != 1) {
      _Unwind_Resume(extraout_RAX);
    }
    plVar2 = (long *)__cxa_begin_catch(extraout_RAX);
    pcVar3 = (char *)(**(code **)(*plVar2 + 0x10))(plVar2);
    poVar4 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar4);
    __cxa_end_catch();
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	try {
		auto arguments = parse_arguments(argc, argv);

		auto positional_arguments = get_positional_arguments(arguments);
		auto named_arguments = get_named_arguments(arguments);
		auto params = flagser_parameters(named_arguments);
		named_arguments_t::const_iterator it;
		if (named_arguments.find("help") != named_arguments.end()) { print_usage_and_exit(-1); }

		if (positional_arguments.size() == 0) { print_usage_and_exit(-1); }
		const char* input_filename = positional_arguments[0];

		filtered_directed_graph_t graph = read_filtered_directed_graph(input_filename, params);

		auto cell_count = count_cells(graph, params);
	} catch (const std::exception& e) { std::cout << e.what() << std::endl; }
}